

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall TiXmlDocument::TiXmlDocument(TiXmlDocument *this)

{
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,TINYXML_DOCUMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDocument_0020bc60;
  (this->errorDesc).rep_ = &TiXmlString::nullrep_;
  (this->errorLocation).col = -1;
  this->tabsize = 4;
  (this->errorLocation).row = -1;
  this->useMicrosoftBOM = false;
  ClearError(this);
  return;
}

Assistant:

TiXmlDocument::TiXmlDocument() : TiXmlNode( TiXmlNode::TINYXML_DOCUMENT )
{
	tabsize = 4;
	useMicrosoftBOM = false;
	ClearError();
}